

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitTableSet(FunctionValidator *this,TableSet *curr)

{
  bool *pbVar1;
  bool bVar2;
  Module *pMVar3;
  BasicType local_34;
  undefined8 local_30;
  size_t local_28;
  Table *local_20;
  Table *table;
  TableSet *curr_local;
  FunctionValidator *this_local;
  
  table = (Table *)curr;
  curr_local = (TableSet *)this;
  pMVar3 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  bVar2 = FeatureSet::hasReferenceTypes(&pMVar3->features);
  shouldBeTrue<wasm::TableSet*>
            (this,bVar2,(TableSet *)table,
             "table.set requires reference types [--enable-reference-types]");
  pMVar3 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  pbVar1 = &(table->super_Importable).super_Named.hasExplicitName;
  local_30 = *(undefined8 *)pbVar1;
  local_28 = (table->super_Importable).module.super_IString.str._M_len;
  local_20 = Module::getTableOrNull(pMVar3,(IString)*(IString *)pbVar1);
  bVar2 = shouldBeTrue<wasm::TableSet*>
                    (this,local_20 != (Table *)0x0,(TableSet *)table,"table.set table must exist");
  if (bVar2) {
    local_34 = unreachable;
    bVar2 = wasm::Type::operator!=
                      ((Type *)&(table->super_Importable).super_Named.name.super_IString.str._M_str,
                       &local_34);
    if (bVar2) {
      shouldBeSubType(this,(Type)*(uintptr_t *)
                                  ((table->super_Importable).base.super_IString.str._M_len + 8),
                      (Type)(local_20->type).id,(Expression *)table,
                      "table.set value must have right type");
    }
    shouldBeEqualOrFirstIsUnreachable<wasm::TableSet*,wasm::Type>
              (this,(Type)*(uintptr_t *)
                           ((table->super_Importable).module.super_IString.str._M_str + 8),
               (Type)(local_20->addressType).id,(TableSet *)table,
               "table.set index must match the table index type.");
  }
  return;
}

Assistant:

void FunctionValidator::visitTableSet(TableSet* curr) {
  shouldBeTrue(getModule()->features.hasReferenceTypes(),
               curr,
               "table.set requires reference types [--enable-reference-types]");
  auto* table = getModule()->getTableOrNull(curr->table);
  if (shouldBeTrue(!!table, curr, "table.set table must exist")) {
    if (curr->type != Type::unreachable) {
      shouldBeSubType(curr->value->type,
                      table->type,
                      curr,
                      "table.set value must have right type");
    }
    shouldBeEqualOrFirstIsUnreachable(
      curr->index->type,
      table->addressType,
      curr,
      "table.set index must match the table index type.");
  }
}